

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_buffer.h
# Opt level: O2

CordRep * __thiscall
absl::lts_20240722::CordBuffer::ConsumeValue(CordBuffer *this,string_view *short_value)

{
  CordRep *pCVar1;
  char *pcVar2;
  size_t sVar3;
  
  if (((this->rep_).field_0.short_rep.raw_size & 1U) == 0) {
    pCVar1 = &Rep::rep(&this->rep_)->super_CordRep;
  }
  else {
    pcVar2 = Rep::data(&this->rep_);
    sVar3 = Rep::short_length(&this->rep_);
    short_value->_M_len = sVar3;
    short_value->_M_str = pcVar2;
    pCVar1 = (CordRep *)0x0;
  }
  (this->rep_).field_0.short_rep.raw_size = '\x01';
  return pCVar1;
}

Assistant:

cord_internal::CordRep* ConsumeValue(absl::string_view& short_value) {
    cord_internal::CordRep* rep = nullptr;
    if (rep_.is_short()) {
      short_value = absl::string_view(rep_.data(), rep_.short_length());
    } else {
      rep = rep_.rep();
    }
    rep_.set_short_length(0);
    return rep;
  }